

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.cpp
# Opt level: O2

bool __thiscall cppcms::url_dispatcher::dispatch(url_dispatcher *this,string *url)

{
  _data *p_Var1;
  pointer psVar2;
  long *plVar3;
  bool bVar4;
  char cVar5;
  request *this_00;
  ulong uVar6;
  uint uVar7;
  undefined1 *puVar8;
  ulong uVar9;
  application *this_01;
  string method;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  string local_50;
  
  local_70 = local_60;
  local_68 = 0;
  local_60[0] = 0;
  this_01 = ((this->d).ptr_)->app;
  uVar7 = 0;
  if (this_01 != (application *)0x0) {
    bVar4 = application::has_context(this_01);
    if (bVar4) {
      this_00 = application::request(this_01);
      http::request::request_method_abi_cxx11_(&local_50,this_00);
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      puVar8 = local_70;
      uVar7 = 0;
      goto LAB_0020c90f;
    }
  }
  puVar8 = (undefined1 *)0x0;
  this_01 = (application *)0x0;
LAB_0020c90f:
  do {
    uVar9 = (ulong)uVar7;
    p_Var1 = (this->d).ptr_;
    psVar2 = (p_Var1->options).
             super__Vector_base<std::shared_ptr<cppcms::(anonymous_namespace)::option>,_std::allocator<std::shared_ptr<cppcms::(anonymous_namespace)::option>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = (long)(p_Var1->options).
                  super__Vector_base<std::shared_ptr<cppcms::(anonymous_namespace)::option>,_std::allocator<std::shared_ptr<cppcms::(anonymous_namespace)::option>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4;
    if (uVar6 <= uVar9) break;
    plVar3 = (long *)psVar2[uVar9].
                     super___shared_ptr<cppcms::(anonymous_namespace)::option,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
    cVar5 = (**(code **)(*plVar3 + 0x10))(plVar3,url,puVar8,this_01);
    uVar7 = uVar7 + 1;
  } while (cVar5 == '\0');
  std::__cxx11::string::~string((string *)&local_70);
  return uVar9 < uVar6;
}

Assistant:

bool url_dispatcher::dispatch(std::string url)
	{
		unsigned i;
		std::string method;
		char const *cmethod = 0;
		application *app = d->app;
		if(app && app->has_context()) {
			method = app->request().request_method();
			cmethod = method.c_str();
		}
		else {
			app = 0;
		}
		for(i=0;i<d->options.size();i++) {
			if(d->options[i]->dispatch(url,cmethod,app))
				return true;
		}
		return false;
	}